

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall xLearn::Parser::~Parser(Parser *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Parser_0023bf90;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  return;
}

Assistant:

virtual ~Parser() {  }